

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O2

ssize_t __thiscall slang::TimeTrace::Profiler::write(Profiler *this,int __fd,void *__buf,size_t __n)

{
  pointer pEVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  id id;
  long lVar5;
  undefined4 extraout_var;
  char *pcVar6;
  undefined4 in_register_00000034;
  ostream *poVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer pEVar8;
  string_view src;
  string_view src_00;
  string_view fmt;
  format_args args;
  int nextThreadId;
  string local_128;
  string local_108;
  anon_class_16_2_334a61d8 getTID;
  int local_d8 [4];
  long local_c8;
  long local_b8;
  pointer local_a8;
  size_type sStack_a0;
  pointer local_98;
  size_type sStack_90;
  string local_80;
  flat_hash_map<std::thread::id,_int> threadIdMap;
  
  poVar7 = (ostream *)CONCAT44(in_register_00000034,__fd);
  std::mutex::lock(&this->mut);
  boost::unordered::
  unordered_flat_map<std::thread::id,_int,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::unordered_flat_map(&threadIdMap);
  getTID.nextThreadId = &nextThreadId;
  nextThreadId = 0;
  getTID.threadIdMap = &threadIdMap;
  id._M_thread = pthread_self();
  write::anon_class_16_2_334a61d8::operator()(&getTID,id);
  std::operator<<(poVar7,"{ \"traceEvents\": [\n");
  pEVar1 = (this->entries).super__Vector_base<slang::Entry,_std::allocator<slang::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar8 = (this->entries).super__Vector_base<slang::Entry,_std::allocator<slang::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar8 != pEVar1; pEVar8 = pEVar8 + 1) {
    lVar2 = (pEVar8->start).__d.__r;
    pcVar6 = (char *)(pEVar8->duration).__r;
    lVar3 = (this->startTime).__d.__r;
    lVar5 = (long)pcVar6 / 1000;
    iVar4 = write::anon_class_16_2_334a61d8::operator()(&getTID,(id)(pEVar8->threadId)._M_thread);
    src._M_str = pcVar6;
    src._M_len = (size_t)(pEVar8->name)._M_dataplus._M_p;
    escapeString_abi_cxx11_(&local_108,(slang *)(pEVar8->name)._M_string_length,src);
    src_00._M_str = pcVar6;
    src_00._M_len = (size_t)(pEVar8->detail)._M_dataplus._M_p;
    escapeString_abi_cxx11_(&local_128,(slang *)(pEVar8->detail)._M_string_length,src_00);
    local_a8 = local_108._M_dataplus._M_p;
    sStack_a0 = local_108._M_string_length;
    local_98 = local_128._M_dataplus._M_p;
    sStack_90 = local_128._M_string_length;
    fmt.size_ = 0xdd331;
    fmt.data_ = (char *)0x5f;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_d8;
    local_d8[0] = iVar4;
    local_c8 = (lVar2 - lVar3) / 1000;
    local_b8 = lVar5;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_80,
               (v11 *)
               "{{ \"pid\":1, \"tid\":{}, \"ph\":\"X\", \"ts\":{}, \"dur\":{}, \"name\":\"{}\", \"args\":{{ \"detail\":\"{}\" }} }},\n"
               ,fmt,args);
    std::operator<<(poVar7,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::operator<<(poVar7,
                  "{ \"cat\":\"\", \"pid\":1, \"tid\":0, \"ts\":0, \"ph\":\"M\", \"name\":\"process_name\", \"args\":{ \"name\":\"slang\" } }\n"
                 );
  std::operator<<(poVar7,"] }\n");
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 *)&threadIdMap);
  iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&this->mut);
  return CONCAT44(extraout_var,iVar4);
}

Assistant:

void write(std::ostream& os) {
        SLANG_ASSERT(stack.empty());
        std::scoped_lock<std::mutex> lock(mut);

        // std::thread::id isn't convertible to an integer, so put it in
        // a table to generate nice ids for output.
        flat_hash_map<std::thread::id, int> threadIdMap;
        int nextThreadId = 0;
        auto getTID = [&](std::thread::id id) {
            auto [it, inserted] = threadIdMap.try_emplace(id, nextThreadId);
            if (inserted)
                ++nextThreadId;
            return it->second;
        };

        // Make sure this thread (presumably the main thread) has ID 0.
        getTID(std::this_thread::get_id());

        os << "{ \"traceEvents\": [\n";

        for (auto& entry : entries) {
            auto startUs = duration_cast<microseconds>(entry.start - startTime).count();
            auto durationUs = duration_cast<microseconds>(entry.duration).count();
            os << fmt::format("{{ \"pid\":1, \"tid\":{}, \"ph\":\"X\", \"ts\":{}, "
                              "\"dur\":{}, \"name\":\"{}\", \"args\":{{ \"detail\":\"{}\" }} }},\n",
                              getTID(entry.threadId), startUs, durationUs, escapeString(entry.name),
                              escapeString(entry.detail));
        }

        // Emit metadata event with process name.
        os << "{ \"cat\":\"\", \"pid\":1, \"tid\":0, \"ts\":0, \"ph\":\"M\", "
              "\"name\":\"process_name\", \"args\":{ \"name\":\"slang\" } }\n";
        os << "] }\n";
    }